

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

optional<long> __thiscall
node::anon_unknown_2::ChainImpl::calculateCombinedBumpFee
          (ChainImpl *this,vector<COutPoint,_std::allocator<COutPoint>_> *outpoints,
          CFeeRate *target_feerate)

{
  long lVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  long in_FS_OFFSET;
  optional<long> oVar4;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_00000178;
  CTxMemPool *in_stack_00000180;
  MiniMiner *in_stack_00000188;
  MiniMiner *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  undefined8 local_198;
  undefined1 local_190;
  CFeeRate *in_stack_ffffffffffffff78;
  MiniMiner *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                     in_stack_fffffffffffffdf8);
  if (bVar2) {
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
               CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    MiniMiner::MiniMiner(in_stack_00000188,in_stack_00000180,in_stack_00000178);
    oVar4 = MiniMiner::CalculateTotalBumpFees(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_198 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload;
    local_190 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    MiniMiner::~MiniMiner(in_stack_fffffffffffffdf8);
    uVar3 = extraout_RDX_00;
  }
  else {
    std::optional<long>::optional<int,_true>
              ((optional<long> *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               in_stack_fffffffffffffe00);
    uVar3 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)uVar3 >> 8);
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_190;
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_198;
    return (optional<long>)
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CAmount> calculateCombinedBumpFee(const std::vector<COutPoint>& outpoints, const CFeeRate& target_feerate) override
    {
        if (!m_node.mempool) {
            return 0;
        }
        return MiniMiner(*m_node.mempool, outpoints).CalculateTotalBumpFees(target_feerate);
    }